

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

EStatusCodeAndObjectIDTypeList * __thiscall
PDFDocumentHandler::CreateFormXObjectsFromPDF
          (EStatusCodeAndObjectIDTypeList *__return_storage_ptr__,PDFDocumentHandler *this,
          IByteReaderWithPosition *inPDFStream,PDFParsingOptions *inParsingOptions,
          PDFPageRange *inPageRange,IPageEmbedInFormCommand *inPageEmbedCommand,
          double *inTransformationMatrix,ObjectIDTypeList *inCopyAdditionalObjects,
          ObjectIDTypeList *inPredefinedFormIDs)

{
  EStatusCode EVar1;
  _List_node_header local_38;
  
  EVar1 = StartCopyingContext(this,inPDFStream,inParsingOptions);
  if (EVar1 == eSuccess) {
    CreateFormXObjectsFromPDFInContext
              (__return_storage_ptr__,this,inPageRange,inPageEmbedCommand,inTransformationMatrix,
               inCopyAdditionalObjects,inPredefinedFormIDs);
  }
  else {
    local_38._M_size = 0;
    __return_storage_ptr__->first = eFailure;
    local_38.super__List_node_base._M_next = &local_38.super__List_node_base;
    local_38.super__List_node_base._M_prev = &local_38.super__List_node_base;
    std::__detail::_List_node_header::_List_node_header
              ((_List_node_header *)&__return_storage_ptr__->second,&local_38);
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
              ((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

EStatusCodeAndObjectIDTypeList PDFDocumentHandler::CreateFormXObjectsFromPDF(	IByteReaderWithPosition* inPDFStream,
																				const PDFParsingOptions& inParsingOptions,
																					const PDFPageRange& inPageRange,
																				IPageEmbedInFormCommand* inPageEmbedCommand,
																				const double* inTransformationMatrix,
																				const ObjectIDTypeList& inCopyAdditionalObjects,
																				const ObjectIDTypeList& inPredefinedFormIDs)
{
	if(StartStreamCopyingContext(inPDFStream, inParsingOptions) != PDFHummus::eSuccess)
		return EStatusCodeAndObjectIDTypeList(PDFHummus::eFailure,ObjectIDTypeList());

	return CreateFormXObjectsFromPDFInContext(inPageRange,inPageEmbedCommand,inTransformationMatrix,inCopyAdditionalObjects, inPredefinedFormIDs);
}